

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

bool __thiscall imrt::Station::canReduceIntensity(Station *this,int beam)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = 0 < this->max_apertures;
  if (0 < this->max_apertures) {
    lVar3 = 0;
    do {
      bVar1 = isOpenBeamlet(this,beam,(int)lVar3);
      if ((bVar1) &&
         (0.0 < (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3])) {
        return bVar2;
      }
      lVar3 = lVar3 + 1;
      bVar2 = lVar3 < this->max_apertures;
    } while (lVar3 < this->max_apertures);
  }
  return bVar2;
}

Assistant:

bool Station::canReduceIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]>0) return(true);
    return(false);
  }